

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void unixDlError(sqlite3_vfs *NotUsed,int nBuf,char *zBufOut)

{
  sqlite3_mutex *psVar1;
  long lVar2;
  
  if (sqlite3Config.bCoreMutex == 0) {
    psVar1 = (sqlite3_mutex *)0x0;
  }
  else {
    psVar1 = (*sqlite3Config.mutex.xMutexAlloc)(0xb);
  }
  if (psVar1 != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(psVar1);
  }
  lVar2 = dlerror();
  if (lVar2 != 0) {
    sqlite3_snprintf(nBuf,zBufOut,"%s",lVar2);
  }
  if (sqlite3Config.bCoreMutex == 0) {
    psVar1 = (sqlite3_mutex *)0x0;
  }
  else {
    psVar1 = (*sqlite3Config.mutex.xMutexAlloc)(0xb);
  }
  if (psVar1 != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(psVar1);
    return;
  }
  return;
}

Assistant:

static void unixDlError(sqlite3_vfs *NotUsed, int nBuf, char *zBufOut){
  const char *zErr;
  UNUSED_PARAMETER(NotUsed);
  unixEnterMutex();
  zErr = dlerror();
  if( zErr ){
    sqlite3_snprintf(nBuf, zBufOut, "%s", zErr);
  }
  unixLeaveMutex();
}